

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

void CVmObjBigNum::shift_left(char *ext,uint shift)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  
  if (shift != 0) {
    uVar1 = *(ushort *)ext;
    uVar5 = (ulong)uVar1;
    if ((shift & 1) == 0) {
      uVar3 = (ulong)(uVar1 + 1 >> 1);
      for (uVar2 = 0; (shift >> 1) + uVar2 < uVar3; uVar2 = uVar2 + 1) {
        ext[uVar2 + 5] = ext[uVar2 + (ulong)(shift >> 1) + 5];
      }
      for (; uVar2 < uVar3; uVar2 = uVar2 + 1) {
        ext[uVar2 + 5] = '\0';
      }
      ext[(uVar5 - shift >> 1) + 5] =
           ext[(uVar5 - shift >> 1) + 5] & '\x0f' << (((byte)uVar1 & 1) << 2);
    }
    else {
      bVar4 = 0;
      for (uVar3 = 0; uVar3 + shift < uVar5; uVar3 = uVar3 + 1) {
        set_dig(ext,uVar3,
                (uint)(int)ext[(uVar3 + shift >> 1) + 5] >> (~((char)(shift << 2) + bVar4) & 4) &
                0xf);
        bVar4 = bVar4 + 4;
      }
      for (; uVar3 < uVar5; uVar3 = uVar3 + 1) {
        ext[(uVar3 >> 1) + 5] = ext[(uVar3 >> 1) + 5] & '\x0f' << (bVar4 & 4);
        bVar4 = bVar4 + 4;
      }
    }
  }
  return;
}

Assistant:

void CVmObjBigNum::shift_left(char *ext, unsigned int shift)
{
    size_t prec = get_prec(ext);
    size_t i;

    /* do nothing with a zero shift */
    if (shift == 0)
        return;

    /* if it's an even shift, it's especially easy */
    if ((shift & 1) == 0)
    {
        /* simply move the bytes left by the required amount */
        for (i = 0 ; i + shift/2 < (prec+1)/2 ; ++i)
            ext[VMBN_MANT + i] = ext[VMBN_MANT + i + shift/2];

        /* zero the remaining digits */
        for ( ; i < (prec+1)/2 ; ++i)
            ext[VMBN_MANT + i] = 0;

        /* 
         *   be sure to zero the last digit - if we have an odd precision, we
         *   will have copied the garbage digit from the final half-byte 
         */
        set_dig(ext, prec - shift, 0);
    }
    else
    {
        /* apply the shift to each digit */
        for (i = 0 ; i + shift < prec  ; ++i)
        {
            unsigned int dig;

            /* get this source digit */
            dig = get_dig(ext, i + shift);

            /* set this destination digit */
            set_dig(ext, i, dig);
        }

        /* zero the remaining digits */
        for ( ; i < prec ; ++i)
            set_dig(ext, i, 0);
    }
}